

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_manager.cpp
# Opt level: O2

void __thiscall
duckdb::SingleFileStorageManager::CreateCheckpoint
          (SingleFileStorageManager *this,optional_ptr<duckdb::ClientContext,_true> client_context,
          CheckpointOptions options)

{
  bool bVar1;
  StorageExtension *pSVar2;
  DBConfig *pDVar3;
  idx_t iVar4;
  type block_manager;
  CheckpointType checkpoint_type;
  AttachedDatabase *pAVar5;
  SingleFileCheckpointWriter checkpointer;
  
  checkpoint_type = options.type;
  bVar1 = StorageManager::InMemory(&this->super_StorageManager);
  if (((!bVar1) && ((this->super_StorageManager).read_only == false)) &&
     ((this->super_StorageManager).load_complete == true)) {
    pAVar5 = (this->super_StorageManager).db;
    pSVar2 = (pAVar5->storage_extension).ptr;
    if (pSVar2 != (StorageExtension *)0x0) {
      checkpointer.super_CheckpointWriter._vptr_CheckpointWriter = (_func_int **)pSVar2;
      pSVar2 = optional_ptr<duckdb::StorageExtension,_true>::operator->
                         ((optional_ptr<duckdb::StorageExtension,_true> *)&checkpointer);
      (**(code **)(*(long *)pSVar2 + 0x10))
                (pSVar2,(this->super_StorageManager).db,options._0_8_,checkpoint_type);
      pAVar5 = (this->super_StorageManager).db;
    }
    pDVar3 = DBConfig::Get(pAVar5);
    iVar4 = StorageManager::GetWALSize(&this->super_StorageManager);
    if ((iVar4 != 0) ||
       ((options.action == ALWAYS_CHECKPOINT | (pDVar3->options).force_checkpoint) == 1)) {
      pAVar5 = (this->super_StorageManager).db;
      block_manager =
           unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>::
           operator*(&this->block_manager);
      SingleFileCheckpointWriter::SingleFileCheckpointWriter
                (&checkpointer,client_context,pAVar5,block_manager,checkpoint_type);
      SingleFileCheckpointWriter::CreateCheckpoint(&checkpointer);
      SingleFileCheckpointWriter::~SingleFileCheckpointWriter(&checkpointer);
    }
    if (options.wal_action == DELETE_WAL) {
      StorageManager::ResetWAL(&this->super_StorageManager);
    }
    checkpointer.super_CheckpointWriter._vptr_CheckpointWriter =
         (_func_int **)(((this->super_StorageManager).db)->storage_extension).ptr;
    if ((StorageExtension *)checkpointer.super_CheckpointWriter._vptr_CheckpointWriter !=
        (StorageExtension *)0x0) {
      pSVar2 = optional_ptr<duckdb::StorageExtension,_true>::operator->
                         ((optional_ptr<duckdb::StorageExtension,_true> *)&checkpointer);
      (**(code **)(*(long *)pSVar2 + 0x18))
                (pSVar2,(this->super_StorageManager).db,options._0_8_,checkpoint_type);
    }
  }
  return;
}

Assistant:

void SingleFileStorageManager::CreateCheckpoint(optional_ptr<ClientContext> client_context, CheckpointOptions options) {
	if (InMemory() || read_only || !load_complete) {
		return;
	}
	if (db.GetStorageExtension()) {
		db.GetStorageExtension()->OnCheckpointStart(db, options);
	}
	auto &config = DBConfig::Get(db);
	if (GetWALSize() > 0 || config.options.force_checkpoint || options.action == CheckpointAction::ALWAYS_CHECKPOINT) {
		// we only need to checkpoint if there is anything in the WAL
		try {
			SingleFileCheckpointWriter checkpointer(client_context, db, *block_manager, options.type);
			checkpointer.CreateCheckpoint();
		} catch (std::exception &ex) {
			ErrorData error(ex);
			throw FatalException("Failed to create checkpoint because of error: %s", error.RawMessage());
		}
	}
	if (options.wal_action == CheckpointWALAction::DELETE_WAL) {
		ResetWAL();
	}

	if (db.GetStorageExtension()) {
		db.GetStorageExtension()->OnCheckpointEnd(db, options);
	}
}